

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSConverter.cpp
# Opt level: O0

void CopyTexture(aiMaterial *mat,Texture *texture,aiTextureType type)

{
  bool bVar1;
  aiTextureMapMode local_424;
  undefined1 local_420 [4];
  int mapMode;
  aiString tex;
  aiTextureType type_local;
  Texture *texture_local;
  aiMaterial *mat_local;
  
  tex.data._1016_4_ = type;
  unique0x100001b1 = texture;
  aiString::aiString((aiString *)local_420);
  aiString::Set((aiString *)local_420,&stack0xffffffffffffffe8->mMapName);
  aiMaterial::AddProperty(mat,(aiString *)local_420,"$tex.file",tex.data._1016_4_,0);
  bVar1 = is_not_qnan<float>(stack0xffffffffffffffe8->mTextureBlend);
  if (bVar1) {
    aiMaterial::AddProperty<float>
              (mat,&stack0xffffffffffffffe8->mTextureBlend,1,"$tex.blend",tex.data._1016_4_,0);
  }
  local_424 = stack0xffffffffffffffe8->mMapMode;
  aiMaterial::AddProperty<int>(mat,(int *)&local_424,1,"$tex.mapmodeu",tex.data._1016_4_,0);
  aiMaterial::AddProperty<int>(mat,(int *)&local_424,1,"$tex.mapmodev",tex.data._1016_4_,0);
  if (stack0xffffffffffffffe8->mMapMode == aiTextureMapMode_Mirror) {
    stack0xffffffffffffffe8->mScaleU = stack0xffffffffffffffe8->mScaleU * 2.0;
    stack0xffffffffffffffe8->mScaleV = stack0xffffffffffffffe8->mScaleV * 2.0;
    stack0xffffffffffffffe8->mOffsetU = stack0xffffffffffffffe8->mOffsetU / 2.0;
    stack0xffffffffffffffe8->mOffsetV = stack0xffffffffffffffe8->mOffsetV / 2.0;
  }
  aiMaterial::AddProperty<float>
            (mat,&stack0xffffffffffffffe8->mOffsetU,5,"$tex.uvtrafo",tex.data._1016_4_,0);
  return;
}

Assistant:

void CopyTexture(aiMaterial& mat, D3DS::Texture& texture, aiTextureType type)
{
    // Setup the texture name
    aiString tex;
    tex.Set( texture.mMapName);
    mat.AddProperty( &tex, AI_MATKEY_TEXTURE(type,0));

    // Setup the texture blend factor
    if (is_not_qnan(texture.mTextureBlend))
        mat.AddProperty<ai_real>( &texture.mTextureBlend, 1, AI_MATKEY_TEXBLEND(type,0));

    // Setup the texture mapping mode
    int mapMode = static_cast<int>(texture.mMapMode);
    mat.AddProperty<int>(&mapMode,1,AI_MATKEY_MAPPINGMODE_U(type,0));
    mat.AddProperty<int>(&mapMode,1,AI_MATKEY_MAPPINGMODE_V(type,0));

    // Mirroring - double the scaling values
    // FIXME: this is not really correct ...
    if (texture.mMapMode == aiTextureMapMode_Mirror)
    {
        texture.mScaleU *= 2.0;
        texture.mScaleV *= 2.0;
        texture.mOffsetU /= 2.0;
        texture.mOffsetV /= 2.0;
    }

    // Setup texture UV transformations
    mat.AddProperty<ai_real>(&texture.mOffsetU,5,AI_MATKEY_UVTRANSFORM(type,0));
}